

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrollarea.cpp
# Opt level: O3

void __thiscall QtMWidgets::ScrollArea::ScrollArea(ScrollArea *this,QWidget *parent)

{
  AbstractScrollAreaPrivate *dd;
  
  *(undefined ***)&this->super_AbstractScrollArea = &PTR_metaObject_00297fc0;
  *(undefined ***)&(this->super_AbstractScrollArea).field_0x10 = &PTR__ScrollArea_00298188;
  dd = (AbstractScrollAreaPrivate *)operator_new(0xc0);
  dd->q = &this->super_AbstractScrollArea;
  (dd->indicatorColor).cspec = Invalid;
  (dd->indicatorColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(dd->indicatorColor).ct + 2) = 0;
  (dd->mousePos).xp = 0;
  (dd->mousePos).yp = 0;
  dd->viewport = (QWidget *)0x0;
  (dd->scrolledAreaSize).wd = 0;
  (dd->scrolledAreaSize).ht = 0;
  (dd->topLeftCorner).xp = 0;
  (dd->topLeftCorner).yp = 0;
  dd->top = 0;
  dd->bottom = 0;
  *(undefined8 *)((long)&dd->top + 1) = 0;
  *(undefined8 *)((long)&dd->right + 1) = 0;
  dd->horIndicator = (ScrollIndicator *)0x0;
  dd->vertIndicator = (ScrollIndicator *)0x0;
  dd->animationTimer = (QTimer *)0x0;
  dd->startBlurAnimTimer = (QTimer *)0x0;
  dd->animationTimeout = 100;
  dd->animationAlphaDelta = 0x19;
  dd->scroller = (Scroller *)0x0;
  dd->horBlur = (BlurEffect *)0x0;
  dd->vertBlur = (BlurEffect *)0x0;
  dd->horBlurAnim = (QVariantAnimation *)0x0;
  dd->vertBlurAnim = (QVariantAnimation *)0x0;
  dd->_vptr_AbstractScrollAreaPrivate = (_func_int **)&PTR__ScrollAreaPrivate_00295a88;
  *(undefined4 *)&dd[1].indicatorColor.ct = 0;
  dd[1]._vptr_AbstractScrollAreaPrivate = (_func_int **)0x0;
  dd[1].q = (AbstractScrollArea *)0x0;
  *(undefined1 *)&dd[1].indicatorColor.cspec = Invalid;
  AbstractScrollArea::AbstractScrollArea(&this->super_AbstractScrollArea,dd,parent);
  *(undefined ***)&this->super_AbstractScrollArea = &PTR_metaObject_00297fc0;
  *(undefined ***)&(this->super_AbstractScrollArea).field_0x10 = &PTR__ScrollArea_00298188;
  QWidget::setBackgroundRole((ColorRole)((this->super_AbstractScrollArea).d.d)->viewport);
  return;
}

Assistant:

ScrollArea::ScrollArea( QWidget * parent )
	:	AbstractScrollArea( new ScrollAreaPrivate( this ), parent )
{
	ScrollAreaPrivate * d = d_func();
	d->viewport->setBackgroundRole( QPalette::NoRole );
}